

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv__setsockopt(uv_udp_t *handle,int option4,int option6,void *val,socklen_t size)

{
  int *piVar1;
  int local_30;
  int r;
  socklen_t size_local;
  void *val_local;
  int option6_local;
  int option4_local;
  uv_udp_t *handle_local;
  
  if ((handle->flags & 0x400000) == 0) {
    local_30 = setsockopt((handle->io_watcher).fd,0,option4,val,size);
  }
  else {
    local_30 = setsockopt((handle->io_watcher).fd,0x29,option6,val,size);
  }
  if (local_30 == 0) {
    handle_local._4_4_ = 0;
  }
  else {
    piVar1 = __errno_location();
    handle_local._4_4_ = -*piVar1;
  }
  return handle_local._4_4_;
}

Assistant:

static int uv__setsockopt(uv_udp_t* handle,
                         int option4,
                         int option6,
                         const void* val,
                         socklen_t size) {
  int r;

  if (handle->flags & UV_HANDLE_IPV6)
    r = setsockopt(handle->io_watcher.fd,
                   IPPROTO_IPV6,
                   option6,
                   val,
                   size);
  else
    r = setsockopt(handle->io_watcher.fd,
                   IPPROTO_IP,
                   option4,
                   val,
                   size);
  if (r)
    return UV__ERR(errno);

  return 0;
}